

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void __thiscall SDLFB::SDLFB(SDLFB *this,int width,int height,bool fullscreen,SDL_Window *oldwin)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  SDL_Window *pSVar5;
  BYTE BVar6;
  undefined8 uVar7;
  PalEntry *local_50;
  FString local_40;
  FString caption;
  int i;
  SDL_Window *oldwin_local;
  bool fullscreen_local;
  int height_local;
  int width_local;
  SDLFB *this_local;
  
  DFrameBuffer::DFrameBuffer(&this->super_DFrameBuffer,width,height);
  (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b60be0;
  local_50 = this->SourcePalette;
  do {
    PalEntry::PalEntry(local_50);
    local_50 = local_50 + 1;
  } while (local_50 != (PalEntry *)this->GammaTable);
  PalEntry::PalEntry(&this->Flash);
  this->NeedPalUpdate = false;
  this->NeedGammaUpdate = false;
  this->UpdatePending = false;
  this->NotPaletted = false;
  this->FlashAmount = 0;
  if (oldwin == (SDL_Window *)0x0) {
    FString::FString(&local_40);
    pcVar3 = GetVersionString();
    pcVar4 = GetGitTime();
    FString::Format(&local_40,"GZDOOM %s (%s)",pcVar3,pcVar4);
    pcVar3 = FString::operator_cast_to_char_(&local_40);
    uVar1 = FIntCVar::operator_cast_to_int(&vid_adapter);
    uVar2 = FIntCVar::operator_cast_to_int(&vid_adapter);
    uVar7 = 0x20;
    if (fullscreen) {
      uVar7 = 0x1021;
    }
    pSVar5 = (SDL_Window *)
             SDL_CreateWindow(pcVar3,uVar1 | 0x1fff0000,uVar2 | 0x1fff0000,width,height,uVar7);
    this->Screen = pSVar5;
    pSVar5 = this->Screen;
    FString::~FString(&local_40);
    if (pSVar5 == (SDL_Window *)0x0) {
      return;
    }
  }
  else {
    this->Screen = oldwin;
    SDL_SetWindowSize(this->Screen,width,height);
    SetFullscreen(this,fullscreen);
  }
  this->Renderer = (SDL_Renderer *)0x0;
  (this->field_8).Texture = (SDL_Texture *)0x0;
  ResetSDLRenderer(this);
  for (caption.Chars._0_4_ = 0; (int)caption.Chars < 0x100;
      caption.Chars._0_4_ = (int)caption.Chars + 1) {
    BVar6 = (BYTE)(int)caption.Chars;
    this->GammaTable[2][(int)caption.Chars] = BVar6;
    this->GammaTable[1][(int)caption.Chars] = BVar6;
    this->GammaTable[0][(int)caption.Chars] = BVar6;
  }
  memcpy(this->SourcePalette,&GPalette,0x400);
  UpdateColors(this);
  return;
}

Assistant:

SDLFB::SDLFB (int width, int height, bool fullscreen, SDL_Window *oldwin)
	: DFrameBuffer (width, height)
{
	int i;
	
	NeedPalUpdate = false;
	NeedGammaUpdate = false;
	UpdatePending = false;
	NotPaletted = false;
	FlashAmount = 0;

	if (oldwin)
	{
		// In some cases (Mac OS X fullscreen) SDL2 doesn't like having multiple windows which
		// appears to inevitably happen while compositor animations are running. So lets try
		// to reuse the existing window.
		Screen = oldwin;
		SDL_SetWindowSize (Screen, width, height);
		SetFullscreen (fullscreen);
	}
	else
	{
		FString caption;
		caption.Format(GAMESIG " %s (%s)", GetVersionString(), GetGitTime());

		Screen = SDL_CreateWindow (caption,
			SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter), SDL_WINDOWPOS_UNDEFINED_DISPLAY(vid_adapter),
			width, height, (fullscreen ? SDL_WINDOW_FULLSCREEN_DESKTOP : 0)|SDL_WINDOW_RESIZABLE);

		if (Screen == NULL)
			return;
	}

	Renderer = NULL;
	Texture = NULL;
	ResetSDLRenderer ();

	for (i = 0; i < 256; i++)
	{
		GammaTable[0][i] = GammaTable[1][i] = GammaTable[2][i] = i;
	}

	memcpy (SourcePalette, GPalette.BaseColors, sizeof(PalEntry)*256);
	UpdateColors ();

#ifdef __APPLE__
	SetVSync (vid_vsync > 0);
#endif
}